

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::OptionsValue
          (string *__return_storage_ptr__,Generator *this,string *class_name,
          string *serialized_options)

{
  bool bVar1;
  string full_class_name;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((serialized_options->_M_string_length != 0) &&
     (bVar1 = GeneratingDescriptorProto(this), !bVar1)) {
    std::operator+(&local_40,"descriptor_pb2.",class_name);
    std::operator+(&local_a0,"_descriptor._ParseOptions(",&local_40);
    std::operator+(&local_80,&local_a0,"(), _b(\'");
    CEscape(&local_c0,serialized_options);
    std::operator+(&local_60,&local_80,&local_c0);
    std::operator+(__return_storage_ptr__,&local_60,"\'))");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"None",(allocator *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string Generator::OptionsValue(
    const string& class_name, const string& serialized_options) const {
  if (serialized_options.length() == 0 || GeneratingDescriptorProto()) {
    return "None";
  } else {
    string full_class_name = "descriptor_pb2." + class_name;
//##!PY25    return "_descriptor._ParseOptions(" + full_class_name + "(), b'"
//##!PY25        + CEscape(serialized_options)+ "')";
    return "_descriptor._ParseOptions(" + full_class_name + "(), _b('"  //##PY25
        + CEscape(serialized_options)+ "'))";  //##PY25
  }
}